

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O1

void __thiscall GLDrawList::DoDrawSorted(GLDrawList *this,SortNode *head)

{
  float fVar1;
  GLDrawItem *pGVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  SortNode *ehead;
  SortNode *pSVar7;
  int iVar8;
  
  fVar4 = gl_RenderState.mClipSplit[1];
  fVar3 = gl_RenderState.mClipSplit[0];
  pGVar2 = (this->drawitems).Array;
  if (pGVar2[head->itemindex].rendertype == GLDIT_FLAT) {
    fVar1 = (this->flats).Array[pGVar2[head->itemindex].index].z;
    iVar8 = (uint)(ViewPos.Z < (double)fVar1) * 2 + -1;
  }
  else {
    fVar1 = 0.0;
    iVar8 = 0;
  }
  if (head->left != (SortNode *)0x0) {
    fVar5 = fVar1;
    if ((iVar8 != 1) && (fVar5 = gl_RenderState.mClipSplit[0], iVar8 == -1)) {
      gl_RenderState.mClipSplit[1] = fVar1;
    }
    gl_RenderState.mClipSplit[0] = fVar5;
    DoDrawSorted(this,head->left);
  }
  gl_RenderState.mClipSplit[0] = fVar3;
  gl_RenderState.mClipSplit[1] = fVar4;
  DoDraw(this,4,head->itemindex,true);
  for (pSVar7 = head->equal; pSVar7 != (SortNode *)0x0; pSVar7 = pSVar7->equal) {
    DoDraw(this,4,pSVar7->itemindex,true);
  }
  if (head->right != (SortNode *)0x0) {
    fVar5 = fVar1;
    fVar6 = fVar4;
    if ((iVar8 != -1) &&
       (fVar5 = gl_RenderState.mClipSplit[0], fVar6 = gl_RenderState.mClipSplit[1], iVar8 == 1)) {
      fVar5 = fVar3;
      fVar6 = fVar1;
    }
    gl_RenderState.mClipSplit[1] = fVar6;
    gl_RenderState.mClipSplit[0] = fVar5;
    DoDrawSorted(this,head->right);
    gl_RenderState.mClipSplit[0] = fVar3;
    gl_RenderState.mClipSplit[1] = fVar4;
  }
  return;
}

Assistant:

void GLDrawList::DoDrawSorted(SortNode * head)
{
	float clipsplit[2];
	int relation = 0;
	float z = 0.f;

	gl_RenderState.GetClipSplit(clipsplit);

	if (drawitems[head->itemindex].rendertype == GLDIT_FLAT)
	{
		z = flats[drawitems[head->itemindex].index].z;
		relation = z > ViewPos.Z ? 1 : -1;
	}


	// left is further away, i.e. for stuff above viewz its z coordinate higher, for stuff below viewz its z coordinate is lower
	if (head->left) 
	{
		if (relation == -1)
		{
			gl_RenderState.SetClipSplit(clipsplit[0], z);	// render below: set flat as top clip plane
		}
		else if (relation == 1)
		{
			gl_RenderState.SetClipSplit(z, clipsplit[1]);	// render above: set flat as bottom clip plane
		}
		DoDrawSorted(head->left);
		gl_RenderState.SetClipSplit(clipsplit);
	}
	DoDraw(GLPASS_TRANSLUCENT, head->itemindex, true);
	if (head->equal)
	{
		SortNode * ehead=head->equal;
		while (ehead)
		{
			DoDraw(GLPASS_TRANSLUCENT, ehead->itemindex, true);
			ehead=ehead->equal;
		}
	}
	// right is closer, i.e. for stuff above viewz its z coordinate is lower, for stuff below viewz its z coordinate is higher
	if (head->right)
	{
		if (relation == 1)
		{
			gl_RenderState.SetClipSplit(clipsplit[0], z);	// render below: set flat as top clip plane
		}
		else if (relation == -1)
		{
			gl_RenderState.SetClipSplit(z, clipsplit[1]);	// render above: set flat as bottom clip plane
		}
		DoDrawSorted(head->right);
		gl_RenderState.SetClipSplit(clipsplit);
	}
}